

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O3

QModelIndex * __thiscall
QTransposeProxyModel::mapFromSource
          (QModelIndex *__return_storage_ptr__,QTransposeProxyModel *this,QModelIndex *sourceIndex)

{
  QTransposeProxyModelPrivate *this_00;
  parameter_type pQVar1;
  
  this_00 = *(QTransposeProxyModelPrivate **)(this + 8);
  pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(&(this_00->super_QAbstractProxyModelPrivate).model);
  if ((((pQVar1 == (parameter_type)0x0) || (sourceIndex->r < 0)) || (sourceIndex->c < 0)) ||
     ((sourceIndex->m).ptr == (QAbstractItemModel *)0x0)) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QTransposeProxyModelPrivate::uncheckedMapFromSource(__return_storage_ptr__,this_00,sourceIndex);
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QTransposeProxyModel::mapFromSource(const QModelIndex &sourceIndex) const
{
    Q_D(const QTransposeProxyModel);
    if (!d->model || !sourceIndex.isValid())
        return QModelIndex();
    Q_ASSERT(d->model->checkIndex(sourceIndex));
    return d->uncheckedMapFromSource(sourceIndex);
}